

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_construct.cc
# Opt level: O1

void __thiscall re2c::Cases::add(Cases *this,uint32_t lb,uint32_t ub,State *to)

{
  uint uVar1;
  Case *pCVar2;
  Case *pCVar3;
  uint uVar4;
  Case *this_00;
  bool bVar5;
  pair<unsigned_int,_unsigned_int> local_30;
  
  uVar1 = this->cases_size;
  bVar5 = uVar1 != 0;
  if (bVar5) {
    this_00 = this->cases;
    if (this_00->to != to) {
      uVar4 = 0;
      pCVar3 = this_00;
      do {
        if (uVar1 - 1 == uVar4) goto LAB_0011de4c;
        this_00 = pCVar3 + 1;
        uVar4 = uVar4 + 1;
        pCVar2 = pCVar3 + 1;
        pCVar3 = this_00;
      } while (pCVar2->to != to);
      bVar5 = uVar4 < uVar1;
    }
    local_30.second = ub;
    local_30.first = lb;
    std::
    vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
    ::emplace_back<std::pair<unsigned_int,unsigned_int>>
              ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                *)this_00,&local_30);
    if (bVar5) {
      return;
    }
  }
LAB_0011de4c:
  local_30.second = ub;
  local_30.first = lb;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<std::pair<unsigned_int,unsigned_int>>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(this->cases + this->cases_size),&local_30);
  uVar1 = this->cases_size;
  this->cases[uVar1].to = to;
  this->cases_size = uVar1 + 1;
  return;
}

Assistant:

void Cases::add (uint32_t lb, uint32_t ub, State * to)
{
	for (uint32_t i = 0; i < cases_size; ++i)
	{
		if (cases[i].to == to)
		{
			cases[i].ranges.push_back (std::make_pair (lb, ub));
			return;
		}
	}
	cases[cases_size].ranges.push_back (std::make_pair (lb, ub));
	cases[cases_size].to = to;
	++cases_size;
}